

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread.c
# Opt level: O0

int test_start_n_thread(_func_void_void_ptr *func,TEST_ARGS *args)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *ptr;
  long in_RSI;
  __start_routine *in_RDI;
  int i_2;
  int i_1;
  TEST_ARGS *test_args;
  pthread_t *t;
  int num_threads;
  int ret;
  int i;
  int local_40;
  int local_3c;
  int local_20;
  int local_1c;
  
  local_20 = 1;
  iVar1 = (int)*(undefined8 *)(in_RSI + 0x10);
  __ptr = malloc(*(long *)(in_RSI + 0x10) << 3);
  ptr = calloc(1,(long)iVar1 * 0x18);
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    *(undefined8 *)((long)ptr + (long)local_3c * 0x18 + 8) = *(undefined8 *)(in_RSI + 8);
  }
  local_1c = 0;
  while( true ) {
    if (iVar1 <= local_1c) {
      for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
        pthread_join(*(pthread_t *)((long)__ptr + (long)local_40 * 8),(void **)0x0);
        if (*(int *)((long)ptr + (long)local_40 * 0x18) == 0) {
          local_20 = 0;
        }
      }
      free(__ptr);
      CRYPTO_free(ptr);
      return local_20;
    }
    iVar2 = pthread_create((pthread_t *)((long)__ptr + (long)local_1c * 8),(pthread_attr_t *)0x0,
                           in_RDI,(void *)((long)ptr + (long)local_1c * 0x18));
    if (iVar2 != 0) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

int test_start_n_thread(void (*func)(void *), TEST_ARGS *args)
{
    int i;
    int ret = GML_OK;
    int num_threads = args->num_threads;
    pthread_t *t;

    t = (pthread_t*)malloc(sizeof(pthread_t) * args->num_threads);
    TEST_ARGS *test_args = calloc(1, num_threads*sizeof(TEST_ARGS));

    /* copy arguments */
    for (int i = 0; i < num_threads; i++)
        test_args[i].N = args->N;

    /* start threads */
    for (i = 0; i < num_threads; i++)
        if (pthread_create(&t[i], NULL, (void*)func, (void*)&test_args[i]))
            return GML_ERROR;

    // sleep(5);

    // pthread_mutex_lock(&mut);
    // for(i = 0; i < n; i++)
    // {
    //     pthread_cond_signal(&cond[i]);
    // }
    // pthread_mutex_unlock(&mut);

    for (int i = 0; i < num_threads; i++) {
        pthread_join(t[i], NULL);
        if (test_args[i].ok == GML_ERROR)
            ret = GML_ERROR;
    }

    free(t);
    CRYPTO_free(test_args);
    return ret;
}